

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O3

void gai_matmul_patch(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
                     Integer *ahi,int avec_pos,Integer g_b,Integer *blo,Integer *bhi,int bvec_pos,
                     Integer g_c,Integer *clo,Integer *chi)

{
  size_t sVar1;
  double *pdVar2;
  int iVar3;
  byte *pbVar4;
  Integer IVar5;
  Integer IVar6;
  logical lVar7;
  logical lVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined8 *alpha_00;
  long lVar17;
  long lVar18;
  Integer IVar19;
  long lVar20;
  void *__s;
  bool bVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long local_410;
  int cjpos;
  int cipos;
  int bjpos;
  int bipos;
  int ajpos;
  int aipos;
  Integer local_3e8;
  long local_3e0;
  double local_3d8;
  double *local_3d0;
  long local_3c8;
  Integer local_3c0;
  byte *local_3b8;
  Integer atype;
  long local_3a8;
  void *local_3a0;
  byte *local_398;
  double *local_390;
  long local_388;
  long local_380;
  Integer *local_378;
  long local_370;
  double *local_368;
  Integer bjhi;
  Integer bjlo;
  Integer bihi;
  Integer ajhi;
  Integer ajlo;
  Integer aihi;
  long local_330;
  Integer local_328;
  void *local_320;
  void *local_318;
  void *local_310;
  undefined8 local_308;
  Integer cjhi;
  Integer cjlo;
  Integer bilo;
  Integer ailo;
  Integer bdim2;
  Integer bdim1;
  Integer adim2;
  Integer adim1;
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  Integer cihi;
  Integer cilo;
  Integer cdim2;
  Integer cdim1;
  Integer local_270;
  Integer crank;
  Integer brank;
  int local_258;
  int cvpos;
  int bvpos;
  int avpos;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  double *local_218;
  long local_210;
  double *local_208;
  Integer arank;
  Integer bdims [7];
  Integer adims [7];
  Integer tmpld [7];
  undefined8 local_138;
  undefined8 uStack_130;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  Integer local_98;
  long local_90;
  long local_88;
  long local_80;
  Integer ctype;
  Integer btype;
  Integer cdims [7];
  
  local_3c0 = g_a;
  local_3b8 = (byte *)transb;
  local_398 = (byte *)transa;
  local_378 = alo;
  local_320 = alpha;
  IVar5 = pnga_nodeid();
  iVar3 = _ga_sync_end;
  local_138 = 0x3ff0000000000000;
  uStack_130 = 0;
  local_308 = 0x3f800000;
  bVar21 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar21) {
    pnga_sync();
  }
  IVar6 = pnga_total_blocks(local_3c0);
  if (((0 < IVar6) || (IVar6 = pnga_total_blocks(g_b), 0 < IVar6)) ||
     (IVar6 = pnga_total_blocks(g_c), 0 < IVar6)) {
    pnga_matmul_basic((char *)local_398,(char *)local_3b8,local_320,beta,local_3c0,local_378,ahi,g_b
                      ,blo,bhi,g_c,clo,chi);
    return;
  }
  lVar7 = pnga_is_mirrored(local_3c0);
  lVar8 = pnga_is_mirrored(g_b);
  if (lVar7 == lVar8) {
    lVar7 = pnga_is_mirrored(local_3c0);
    lVar8 = pnga_is_mirrored(g_c);
    if (lVar7 != lVar8) goto LAB_0013193f;
  }
  else {
LAB_0013193f:
    IVar6 = pnga_nnodes();
    pnga_error("Processors do not match for all arrays",IVar6);
  }
  lVar7 = pnga_is_mirrored(local_3c0);
  if (lVar7 == 0) {
    local_3e8 = pnga_nnodes();
  }
  else {
    IVar6 = pnga_cluster_nodeid();
    local_3e8 = pnga_cluster_nprocs(IVar6);
    IVar6 = pnga_cluster_procid(IVar6,0);
    IVar5 = IVar5 - IVar6;
  }
  pnga_inquire(local_3c0,&atype,&arank,adims);
  pnga_inquire(g_b,&btype,&brank,bdims);
  pnga_inquire(g_c,&ctype,&crank,cdims);
  if (arank < 2) {
    pnga_error("rank of A must be at least 2",arank);
  }
  if (brank < 2) {
    pnga_error("rank of B must be at least 2",brank);
  }
  if (crank < 2) {
    pnga_error("rank of C must be at least 2",crank);
  }
  if ((atype != btype) || (atype != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  local_258 = iVar3;
  local_390 = (double *)beta;
  local_270 = IVar5;
  if ((4 < atype - 0x3ebU) || (atype - 0x3ebU == 2)) {
    pnga_error(" type error",atype);
  }
  pbVar4 = local_398;
  gai_setup_2d_patch(arank,(char *)local_398,adims,local_378,ahi,&ailo,&aihi,&ajlo,&ajhi,&adim1,
                     &adim2,&aipos,&ajpos,&avpos,avec_pos);
  gai_setup_2d_patch(brank,(char *)local_3b8,bdims,blo,bhi,&bilo,&bihi,&bjlo,&bjhi,&bdim1,&bdim2,
                     &bipos,&bjpos,&bvpos,bvec_pos);
  gai_setup_2d_patch(crank,(char *)0x0,cdims,clo,chi,&cilo,&cihi,&cjlo,&cjhi,&cdim1,&cdim2,&cipos,
                     &cjpos,&cvpos,-1);
  if ((*pbVar4 | 0x20) == 0x6e) {
    if (((ailo < 1) || (adim1 < aihi)) || (lVar20 = adim2, ajlo < 1)) goto LAB_00131ce0;
joined_r0x00131cde:
    local_3c8 = ailo;
    if (lVar20 < ajhi) goto LAB_00131ce0;
  }
  else {
    if (((0 < ailo) && (aihi <= adim2)) && (lVar20 = adim1, 0 < ajlo)) goto joined_r0x00131cde;
LAB_00131ce0:
    local_3c8 = ailo;
    pnga_error("  g_a indices out of range ",local_3c0);
  }
  if ((*local_3b8 | 0x20) == 0x6e) {
    if (((bilo < 1) || (bdim1 < bihi)) || (lVar20 = bdim2, bjlo < 1)) goto LAB_00131d85;
joined_r0x00131d83:
    local_3a8 = bilo;
    if (lVar20 < bjhi) goto LAB_00131d85;
  }
  else {
    if (((0 < bilo) && (bihi <= bdim2)) && (lVar20 = bdim1, 0 < bjlo)) goto joined_r0x00131d83;
LAB_00131d85:
    local_3a8 = bilo;
    pnga_error("  g_b indices out of range ",g_b);
  }
  lVar20 = cihi;
  IVar5 = cjlo;
  lVar11 = cjhi;
  local_380 = cilo;
  if (((cilo < 1) || (cdim1 < cihi)) || ((cjlo < 1 || (cdim2 < cjhi)))) {
    pnga_error("  g_c indices out of range ",g_c);
  }
  IVar19 = bihi;
  IVar6 = local_3e8;
  lVar15 = aihi - local_3c8;
  local_3e0 = lVar15 + 1;
  local_388 = ajlo;
  lVar17 = ajhi - ajlo;
  local_410 = lVar17 + 1;
  pdVar9 = (double *)bihi;
  lVar18 = bihi - local_3a8;
  pdVar2 = (double *)bjhi;
  local_330 = bjlo;
  lVar13 = bjhi - bjlo;
  lVar10 = lVar13 + 1;
  lVar16 = lVar20 - local_380;
  local_328 = IVar5;
  lVar14 = lVar11 - IVar5;
  if (((lVar15 != lVar16) || (lVar17 != lVar18)) || (lVar13 != lVar14)) {
    local_368 = (double *)bjhi;
    local_3d8 = (double)ajhi;
    local_3d0 = (double *)bihi;
    if (-1 < cvpos || (-1 < bvpos || avpos < 0)) {
      local_370 = aihi;
      if (-1 < cvpos || (bvpos < 0 || -1 < avpos)) {
        if (cvpos < 0 || -1 < (avpos & bvpos)) {
          bVar21 = (avpos | bvpos) < 0;
          if (-1 < cvpos || bVar21) {
            if ((-1 < bvpos || avpos < 0) || cvpos < 0) {
              if ((bvpos < 0 || -1 < avpos) || cvpos < 0) {
                if (!bVar21 && -1 < cvpos) {
                  pnga_error("a and b and c ambiguous",1);
                }
              }
              else {
                if (lVar17 != lVar18) {
                  lVar10 = (long)bipos;
                  bipos = bipos + -1;
                  lVar13 = (long)bjpos;
                  bjpos = bjpos + -1;
                  local_3a8 = blo[lVar10 + -1];
                  bihi = bhi[lVar10 + -1];
                  bjlo = blo[lVar13 + -1];
                  bjhi = bhi[lVar13 + -1];
                  bdim1 = bdims[lVar10 + -1];
                  bdim2 = bdims[lVar13 + -1];
                  lVar10 = (bjhi - bjlo) + 1;
                  bilo = local_3a8;
                }
                IVar19 = bihi;
                local_368 = (double *)bjhi;
                local_330 = bjlo;
                if (lVar15 != lVar16) {
                  lVar10 = (long)cipos;
                  cipos = cipos + -1;
                  lVar13 = (long)cjpos;
                  cjpos = cjpos + -1;
                  local_380 = clo[lVar10 + -1];
                  lVar20 = chi[lVar10 + -1];
                  local_328 = clo[lVar13 + -1];
                  lVar11 = chi[lVar13 + -1];
                  cdim1 = cdims[lVar10 + -1];
                  cdim2 = cdims[lVar13 + -1];
                  lVar10 = (bjhi - bjlo) + 1;
                  local_368 = (double *)bjhi;
                  cjhi = lVar11;
                  cjlo = local_328;
                  cihi = lVar20;
                  cilo = local_380;
                }
              }
            }
            else {
              if (lVar17 != lVar18) {
                lVar15 = (long)aipos;
                aipos = aipos + -1;
                lVar16 = (long)ajpos;
                ajpos = ajpos + -1;
                local_3c8 = local_378[lVar15 + -1];
                aihi = ahi[lVar15 + -1];
                ajlo = local_378[lVar16 + -1];
                ajhi = ahi[lVar16 + -1];
                adim1 = adims[lVar15 + -1];
                adim2 = adims[lVar16 + -1];
                local_3e0 = (aihi - local_3c8) + 1;
                local_410 = (ajhi - ajlo) + 1;
                ailo = local_3c8;
              }
              local_3d8 = (double)ajhi;
              local_388 = ajlo;
              local_370 = aihi;
              if (lVar13 != lVar14) {
                lVar13 = (long)cipos;
                cipos = cipos + -1;
                lVar14 = (long)cjpos;
                cjpos = cjpos + -1;
                local_380 = clo[lVar13 + -1];
                lVar20 = chi[lVar13 + -1];
                local_328 = clo[lVar14 + -1];
                lVar11 = chi[lVar14 + -1];
                cdim1 = cdims[lVar13 + -1];
                cdim2 = cdims[lVar14 + -1];
                local_3e0 = (aihi - local_3c8) + 1;
                local_410 = (ajhi - ajlo) + 1;
                local_3d8 = (double)ajhi;
                local_370 = aihi;
                cjhi = lVar11;
                cjlo = local_328;
                cihi = lVar20;
                cilo = local_380;
              }
            }
          }
          else {
            if (lVar15 != lVar16) {
              lVar15 = (long)aipos;
              aipos = aipos + -1;
              lVar16 = (long)ajpos;
              ajpos = ajpos + -1;
              local_3c8 = local_378[lVar15 + -1];
              aihi = ahi[lVar15 + -1];
              ajlo = local_378[lVar16 + -1];
              ajhi = ahi[lVar16 + -1];
              adim1 = adims[lVar15 + -1];
              adim2 = adims[lVar16 + -1];
              local_3e0 = (aihi - local_3c8) + 1;
              local_410 = (ajhi - ajlo) + 1;
              ailo = local_3c8;
            }
            local_3d8 = (double)ajhi;
            local_388 = ajlo;
            local_370 = aihi;
            if (lVar13 != lVar14) {
              lVar10 = (long)bipos;
              bipos = bipos + -1;
              lVar13 = (long)bjpos;
              bjpos = bjpos + -1;
              local_3a8 = blo[lVar10 + -1];
              bihi = bhi[lVar10 + -1];
              bjlo = blo[lVar13 + -1];
              bjhi = bhi[lVar13 + -1];
              bdim1 = bdims[lVar10 + -1];
              bdim2 = bdims[lVar13 + -1];
              local_3e0 = (aihi - local_3c8) + 1;
              local_410 = (ajhi - ajlo) + 1;
              lVar10 = (bjhi - bjlo) + 1;
              IVar19 = bihi;
              local_3d8 = (double)ajhi;
              local_370 = aihi;
              local_330 = bjlo;
              bilo = local_3a8;
            }
          }
        }
        else {
          lVar13 = (long)cipos;
          cipos = cipos + -1;
          lVar14 = (long)cjpos;
          cjpos = cjpos + -1;
          local_380 = clo[lVar13 + -1];
          lVar20 = chi[lVar13 + -1];
          local_328 = clo[lVar14 + -1];
          lVar11 = chi[lVar14 + -1];
          cdim1 = cdims[lVar13 + -1];
          cdim2 = cdims[lVar14 + -1];
          cjhi = lVar11;
          cjlo = local_328;
          cihi = lVar20;
          cilo = local_380;
        }
      }
      else {
        lVar10 = (long)bipos;
        bipos = bipos + -1;
        lVar13 = (long)bjpos;
        bjpos = bjpos + -1;
        local_3a8 = blo[lVar10 + -1];
        bihi = bhi[lVar10 + -1];
        bjlo = blo[lVar13 + -1];
        bjhi = bhi[lVar13 + -1];
        bdim1 = bdims[lVar10 + -1];
        bdim2 = bdims[lVar13 + -1];
        lVar10 = (bjhi - bjlo) + 1;
        IVar19 = bihi;
        local_330 = bjlo;
        bilo = local_3a8;
      }
    }
    else {
      lVar13 = (long)aipos;
      aipos = aipos + -1;
      lVar14 = (long)ajpos;
      ajpos = ajpos + -1;
      local_3c8 = local_378[lVar13 + -1];
      aihi = ahi[lVar13 + -1];
      local_388 = local_378[lVar14 + -1];
      ajhi = ahi[lVar14 + -1];
      adim1 = adims[lVar13 + -1];
      adim2 = adims[lVar14 + -1];
      local_3e0 = (aihi - local_3c8) + 1;
      local_410 = (ajhi - local_388) + 1;
      ajlo = local_388;
      ailo = local_3c8;
    }
  }
  if ((lVar20 - local_380) + 1 != local_3e0) {
    pnga_error(" a & c dims error",local_3e0);
  }
  if ((lVar11 - local_328) + 1 != lVar10) {
    pnga_error(" b & c dims error",lVar10);
  }
  if ((IVar19 - local_3a8) + 1 != local_410) {
    pnga_error(" a & b dims error",local_410);
  }
  dVar23 = pow(((double)(local_3e0 * lVar10) * (double)local_410) / (double)(IVar6 * 10),
               0.3333333333333333);
  lVar11 = (long)dVar23;
  lVar20 = 0x20;
  if (0x20 < lVar11) {
    lVar20 = lVar11;
  }
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(BYTE_ARRAY_001e1031 + atype * 0x10 + 0x2d7);
  pdVar9 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) / auVar30,0);
  if (lVar11 < 0x101) {
    lVar11 = (long)pdVar9 * 4 + 0x30000;
    lVar13 = 0x100;
    lVar14 = 0x100;
    lVar20 = 0x100;
  }
  else {
    local_3d0 = pdVar9;
    tmpld[0] = pnga_memory_avail_type(atype);
    IVar5 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar5,tmpld,1,"min");
    if ((tmpld[0] < 0x40) && (IVar5 = pnga_nodeid(), IVar5 == 0)) {
      pnga_error("Not enough memory",tmpld[0]);
    }
    lVar11 = (long)((double)tmpld[0] * 0.9);
    dVar23 = (double)((lVar11 + -4) / 3);
    if (dVar23 < 0.0) {
      local_3d8 = dVar23;
      dVar24 = sqrt(dVar23);
      dVar23 = local_3d8;
    }
    else {
      dVar24 = SQRT(dVar23);
    }
    if ((long)dVar24 < lVar20) {
      if (dVar23 < 0.0) {
        dVar23 = sqrt(dVar23);
      }
      else {
        dVar23 = SQRT(dVar23);
      }
      lVar20 = (long)dVar23;
    }
    lVar13 = lVar20;
    if (local_3e0 < lVar20) {
      lVar13 = local_3e0;
    }
    lVar14 = lVar20;
    if (lVar10 < lVar20) {
      lVar14 = lVar10;
    }
    pdVar9 = local_3d0;
    if (local_410 < lVar20) {
      lVar20 = local_410;
    }
  }
  local_3a0 = pnga_malloc(lVar11,(int)atype,"GA mulmat bufs");
  IVar5 = local_270;
  local_230 = lVar13;
  local_120 = lVar14;
  local_110 = lVar20;
  if (atype == 0x3ec) {
    bVar21 = NAN(*local_390);
    bVar22 = *local_390 == 0.0;
LAB_001324a1:
    if ((bVar22) && (!bVar21)) {
      pnga_fill_patch(g_c,clo,chi,local_390);
      goto LAB_001324e1;
    }
  }
  else {
    if (atype != 0x3ee) {
      if (atype == 0x3ef) {
        if ((*local_390 != 0.0) || (NAN(*local_390))) goto LAB_001324c4;
        bVar21 = NAN(local_390[1]);
        bVar22 = local_390[1] == 0.0;
      }
      else {
        bVar21 = NAN(*(float *)local_390);
        bVar22 = *(float *)local_390 == 0.0;
      }
      goto LAB_001324a1;
    }
    if ((*(float *)local_390 == 0.0) && (!NAN(*(float *)local_390))) {
      bVar21 = NAN(*(float *)((long)local_390 + 4));
      bVar22 = *(float *)((long)local_390 + 4) == 0.0;
      goto LAB_001324a1;
    }
  }
LAB_001324c4:
  pnga_scale_patch(g_c,clo,chi,local_390);
LAB_001324e1:
  if (0 < lVar10) {
    lVar11 = ((lVar20 * lVar13) / (long)pdVar9) * 0x10;
    local_310 = (void *)((long)local_3a0 + lVar11 + 0x10);
    __s = (void *)((long)local_3a0 + ((lVar14 * lVar20) / (long)pdVar9) * 0x10 + 0x20 + lVar11);
    local_b8 = (long)aipos;
    local_c0 = (long)ajpos;
    local_f0 = (long)bipos;
    local_f8 = (long)bjpos;
    local_c8 = (long)cipos;
    local_d0 = (long)cjpos;
    local_248 = 0;
    lVar20 = 0;
    local_118 = 0;
    lVar11 = local_3e0;
    lVar13 = local_230;
    local_318 = __s;
    do {
      lVar14 = local_120 + local_118;
      lVar15 = lVar14;
      if (lVar10 < lVar14) {
        lVar15 = lVar10;
      }
      if (0 < local_410) {
        local_a8 = lVar15 + -1;
        local_3d0 = (double *)((local_a8 - local_118) + 1);
        lVar15 = lVar15 - local_120 * local_248;
        local_238 = local_330 + local_118;
        local_240 = local_330 + local_a8;
        local_98 = local_118 + local_328;
        local_a8 = local_a8 + local_328;
        local_b0 = (local_a8 - local_98) + 1;
        local_d8 = lVar15 * 8;
        local_108 = lVar15 * 4;
        lVar15 = lVar15 * 0x10;
        local_100 = 0;
        local_118 = lVar14;
        local_a0 = lVar15;
        do {
          lVar16 = local_110 + local_100;
          lVar14 = lVar16;
          if (local_410 < lVar16) {
            lVar14 = local_410;
          }
          if (0 < lVar11) {
            lVar14 = lVar14 + -1;
            local_368 = (double *)((lVar14 - local_100) + 1);
            local_220 = local_388 + local_100;
            local_228 = local_388 + lVar14;
            local_e0 = local_100 + local_3a8;
            local_e8 = lVar14 + local_3a8;
            local_3d8 = 4.94065645841247e-324;
            lVar14 = 0;
            lVar17 = 0;
            local_100 = lVar16;
            do {
              lVar18 = lVar13 + lVar17;
              lVar16 = lVar18;
              if (lVar11 < lVar18) {
                lVar16 = lVar11;
              }
              if (lVar20 % IVar6 == IVar5) {
                dVar23 = (double)(lVar16 + -1);
                local_390 = (double *)(((long)dVar23 - lVar17) + 1);
                lVar11 = local_108;
                if (((atype != 0x3eb) && (lVar11 = local_d8, atype != 0x3ec)) && (atype != 0x3ee)) {
                  lVar11 = lVar15;
                }
                local_88 = lVar18;
                local_80 = lVar14;
                if (0 < (long)local_390 * (long)local_3d0) {
                  memset(__s,0,lVar11 * (lVar16 - lVar13 * lVar14));
                }
                IVar5 = arank;
                if ((*local_398 | 0x20) == 0x6e) {
                  local_208 = local_390;
                  local_210 = local_220;
                  lVar13 = local_3c8 + lVar17;
                  lVar11 = local_228;
                  lVar14 = local_3c8 + (long)dVar23;
                }
                else {
                  local_210 = local_3c8 + lVar17;
                  lVar11 = local_3c8 + (long)dVar23;
                  local_208 = local_368;
                  lVar13 = local_220;
                  lVar14 = local_228;
                }
                sVar1 = arank * 8;
                local_370 = lVar20;
                local_90 = lVar17;
                memcpy(adims,local_378,sVar1);
                memcpy(bdims,ahi,sVar1);
                if (1 < IVar5) {
                  lVar20 = IVar5 + -2;
                  auVar25._8_4_ = (int)lVar20;
                  auVar25._0_8_ = lVar20;
                  auVar25._12_4_ = (int)((ulong)lVar20 >> 0x20);
                  auVar25 = auVar25 ^ _DAT_001be890;
                  uVar12 = 0;
                  auVar31 = _DAT_001be8b0;
                  do {
                    auVar30 = auVar31 ^ _DAT_001be890;
                    if ((bool)(~(auVar25._4_4_ < auVar30._4_4_ ||
                                auVar25._0_4_ < auVar30._0_4_ && auVar30._4_4_ == auVar25._4_4_) & 1
                              )) {
                      tmpld[uVar12] = 1;
                    }
                    if (auVar30._12_4_ <= auVar25._12_4_ &&
                        (auVar30._8_4_ <= auVar25._8_4_ || auVar30._12_4_ != auVar25._12_4_)) {
                      tmpld[uVar12 + 1] = 1;
                    }
                    uVar12 = uVar12 + 2;
                    lVar20 = auVar31._8_8_;
                    auVar31._0_8_ = auVar31._0_8_ + 2;
                    auVar31._8_8_ = lVar20 + 2;
                  } while ((IVar5 & 0x7ffffffffffffffeU) != uVar12);
                }
                lVar15 = local_b8;
                adims[local_b8] = lVar13;
                bdims[lVar15] = lVar14;
                lVar20 = local_c0;
                adims[local_c0] = local_210;
                bdims[lVar20] = lVar11;
                tmpld[lVar15] = (lVar14 - lVar13) + 1;
                tmpld[lVar20] = (lVar11 - local_210) + 1;
                pnga_get(local_3c0,adims,bdims,local_3a0,tmpld);
                IVar5 = brank;
                if (local_3d8 != 0.0) {
                  local_218 = local_368;
                  lVar20 = local_238;
                  lVar11 = local_240;
                  lVar13 = local_e0;
                  lVar14 = local_e8;
                  if ((*local_3b8 | 0x20) != 0x6e) {
                    local_218 = local_3d0;
                    lVar20 = local_e0;
                    lVar11 = local_e8;
                    lVar13 = local_238;
                    lVar14 = local_240;
                  }
                  sVar1 = brank * 8;
                  local_3d8 = dVar23;
                  memcpy(adims,blo,sVar1);
                  memcpy(bdims,bhi,sVar1);
                  dVar23 = local_3d8;
                  if (1 < IVar5) {
                    lVar15 = IVar5 + -2;
                    auVar26._8_4_ = (int)lVar15;
                    auVar26._0_8_ = lVar15;
                    auVar26._12_4_ = (int)((ulong)lVar15 >> 0x20);
                    uVar12 = 0;
                    auVar28 = _DAT_001be8b0;
                    do {
                      auVar30 = auVar26 ^ _DAT_001be890;
                      auVar31 = auVar28 ^ _DAT_001be890;
                      if ((bool)(~(auVar31._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar31._0_4_
                                  || auVar30._4_4_ < auVar31._4_4_) & 1)) {
                        tmpld[uVar12] = 1;
                      }
                      if (auVar31._12_4_ <= auVar30._12_4_ &&
                          (auVar31._12_4_ != auVar30._12_4_ || auVar31._8_4_ <= auVar30._8_4_)) {
                        tmpld[uVar12 + 1] = 1;
                      }
                      uVar12 = uVar12 + 2;
                      lVar15 = auVar28._8_8_;
                      auVar28._0_8_ = auVar28._0_8_ + 2;
                      auVar28._8_8_ = lVar15 + 2;
                    } while ((IVar5 & 0x7ffffffffffffffeU) != uVar12);
                  }
                  lVar16 = local_f0;
                  adims[local_f0] = lVar13;
                  bdims[lVar16] = lVar14;
                  lVar15 = local_f8;
                  adims[local_f8] = lVar20;
                  bdims[lVar15] = lVar11;
                  tmpld[lVar16] = (lVar14 - lVar13) + 1;
                  tmpld[lVar15] = (lVar11 - lVar20) + 1;
                  pnga_get(g_b,adims,bdims,local_310,tmpld);
                }
                __s = local_318;
                idim_t = (long)local_390;
                jdim_t = (long)local_3d0;
                kdim_t = (long)local_368;
                adim_t = (long)local_208;
                bdim_t = (long)local_218;
                cdim_t = (long)local_390;
                switch(atype) {
                case 0x3eb:
                  gal_sgemm_(local_398,local_3b8,&idim_t,&jdim_t,&kdim_t,local_320,local_3a0,&adim_t
                             ,local_310,&bdim_t,&local_308,local_318,&cdim_t,1,1);
                  break;
                case 0x3ec:
                  gal_dgemm_(local_398,local_3b8,&idim_t,&jdim_t,&kdim_t,local_320,local_3a0,&adim_t
                             ,local_310,&bdim_t,&local_138,local_318,&cdim_t,1,1);
                  break;
                default:
                  pnga_error("ga_matmul_patch: wrong data type",atype);
                  __s = local_318;
                  break;
                case 0x3ee:
                  gal_cgemm_(local_398,local_3b8,&idim_t,&jdim_t,&kdim_t,local_320,local_3a0,&adim_t
                             ,local_310,&bdim_t,&local_308,local_318,&cdim_t,1,1);
                  break;
                case 0x3ef:
                  gal_zgemm_(local_398,local_3b8,&idim_t,&jdim_t,&kdim_t,local_320,local_3a0,&adim_t
                             ,local_310,&bdim_t,&local_138,local_318,&cdim_t,1,1);
                }
                IVar19 = crank;
                IVar6 = local_3e8;
                alpha_00 = &local_308;
                sVar1 = crank * 8;
                memcpy(adims,clo,sVar1);
                memcpy(bdims,chi,sVar1);
                lVar20 = local_90;
                IVar5 = local_270;
                if (1 < IVar19) {
                  lVar11 = IVar19 + -2;
                  auVar27._8_4_ = (int)lVar11;
                  auVar27._0_8_ = lVar11;
                  auVar27._12_4_ = (int)((ulong)lVar11 >> 0x20);
                  auVar27 = auVar27 ^ _DAT_001be890;
                  uVar12 = 0;
                  auVar29 = _DAT_001be8b0;
                  do {
                    auVar30 = auVar29 ^ _DAT_001be890;
                    if ((bool)(~(auVar27._4_4_ < auVar30._4_4_ ||
                                auVar27._0_4_ < auVar30._0_4_ && auVar30._4_4_ == auVar27._4_4_) & 1
                              )) {
                      tmpld[uVar12] = 1;
                    }
                    if (auVar30._12_4_ <= auVar27._12_4_ &&
                        (auVar30._8_4_ <= auVar27._8_4_ || auVar30._12_4_ != auVar27._12_4_)) {
                      tmpld[uVar12 + 1] = 1;
                    }
                    uVar12 = uVar12 + 2;
                    lVar11 = auVar29._8_8_;
                    auVar29._0_8_ = auVar29._0_8_ + 2;
                    auVar29._8_8_ = lVar11 + 2;
                  } while ((IVar19 & 0x7ffffffffffffffeU) != uVar12);
                }
                lVar13 = local_c8;
                adims[local_c8] = lVar20 + local_380;
                bdims[lVar13] = (long)dVar23 + local_380;
                lVar11 = local_d0;
                adims[local_d0] = local_98;
                bdims[lVar11] = local_a8;
                tmpld[lVar13] = (((long)dVar23 + local_380) - (lVar20 + local_380)) + 1;
                tmpld[lVar11] = local_b0;
                if ((atype != 0x3eb) && (atype != 0x3ee)) {
                  alpha_00 = &local_138;
                }
                pnga_acc(g_c,adims,bdims,__s,tmpld,alpha_00);
                local_3d8 = 0.0;
                lVar14 = local_80;
                lVar20 = local_370;
                lVar11 = local_3e0;
                lVar13 = local_230;
                lVar18 = local_88;
                lVar15 = local_a0;
              }
              lVar20 = lVar20 + 1;
              lVar14 = lVar14 + 1;
              lVar17 = lVar18;
              lVar16 = local_100;
            } while (lVar18 < lVar11);
          }
          local_100 = lVar16;
          lVar14 = local_118;
        } while (local_100 < local_410);
      }
      local_118 = lVar14;
      local_248 = local_248 + 1;
    } while (local_118 < lVar10);
  }
  pnga_free(local_3a0);
  if (local_258 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void gai_matmul_patch(char *transa, char *transb, void *alpha, void *beta, 
    Integer g_a, Integer alo[], Integer ahi[], int avec_pos,
    Integer g_b, Integer blo[], Integer bhi[], int bvec_pos,
    Integer g_c, Integer clo[], Integer chi[])
{
#ifdef STATBUF
   DoubleComplex a[ICHUNK*KCHUNK], b[KCHUNK*JCHUNK], c[ICHUNK*JCHUNK];
#else
   DoubleComplex *a, *b, *c;
#endif
Integer atype, btype, ctype, adim1, adim2, bdim1, bdim2, cdim1, cdim2;
Integer me= pnga_nodeid(), nproc, inode, iproc;
Integer i, ijk = 0, i0, i1, j0, j1;
Integer ilo, ihi, idim, jlo, jhi, jdim, klo, khi, kdim;
Integer n, m, k, k2, cm, cn, adim, bdim, cdim, arank, brank, crank;
int aipos, ajpos, bipos, bjpos,cipos, cjpos, need_scaling=1;
int avpos, bvpos, cvpos;
Integer Ichunk, Kchunk, Jchunk;
Integer ailo, aihi, ajlo, ajhi;    /* 2d plane of g_a */
Integer bilo, bihi, bjlo, bjhi;    /* 2d plane of g_b */
Integer cilo, cihi, cjlo, cjhi;    /* 2d plane of g_c */
Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM],cdims[GA_MAX_DIM],tmpld[GA_MAX_DIM];
Integer *tmplo = adims, *tmphi =bdims; 
DoubleComplex ONE;
SingleComplex ONE_CF;
Integer ZERO_I = 0;
Integer get_new_B;
DoublePrecision chunk_cube;
Integer min_tasks = 10, max_chunk;
int local_sync_begin,local_sync_end;
BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;

   ONE.real =1.; ONE.imag =0.;
   ONE_CF.real =1.; ONE_CF.imag =0.;
   
   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(local_sync_begin)pnga_sync();

   if (pnga_total_blocks(g_a) > 0 || pnga_total_blocks(g_b) > 0 ||
       pnga_total_blocks(g_c) > 0) {
     pnga_matmul_basic(transa, transb, alpha, beta, g_a, alo, ahi,
         g_b, blo, bhi, g_c, clo, chi);
     return;
   }

   /* Check to make sure all global arrays are of the same type */
   if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
        pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
     pnga_error("Processors do not match for all arrays",pnga_nnodes());
   }
   if (pnga_is_mirrored(g_a)) {
     inode = pnga_cluster_nodeid();
     nproc = pnga_cluster_nprocs(inode);
     iproc = me - pnga_cluster_procid(inode, ZERO_I);
   } else {
     nproc = pnga_nnodes();
     iproc = me;
   }

   pnga_inquire(g_a, &atype, &arank, adims);
   pnga_inquire(g_b, &btype, &brank, bdims);
   pnga_inquire(g_c, &ctype, &crank, cdims);

   if(arank<2)  pnga_error("rank of A must be at least 2",arank);
   if(brank<2)  pnga_error("rank of B must be at least 2",brank);
   if(crank<2)  pnga_error("rank of C must be at least 2",crank);

   if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
   if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
     pnga_error(" type error",atype);
   
   gai_setup_2d_patch(arank, transa, adims, alo, ahi, &ailo, &aihi,
                      &ajlo, &ajhi, &adim1, &adim2, &aipos, &ajpos, &avpos, avec_pos);
   gai_setup_2d_patch(brank, transb, bdims, blo, bhi, &bilo, &bihi,
                      &bjlo, &bjhi, &bdim1, &bdim2, &bipos, &bjpos, &bvpos, bvec_pos);
   gai_setup_2d_patch(crank, NULL, cdims, clo, chi, &cilo, &cihi,
                      &cjlo, &cjhi, &cdim1, &cdim2, &cipos, &cjpos, &cvpos, -1);


   /* check if patch indices and dims match */
   if (*transa == 'n' || *transa == 'N'){
      if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
         pnga_error("  g_a indices out of range ", g_a);
   }else
      if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
         pnga_error("  g_a indices out of range ", g_a);

   if (*transb == 'n' || *transb == 'N'){
      if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
          pnga_error("  g_b indices out of range ", g_b);
   }else
      if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
          pnga_error("  g_b indices out of range ", g_b);


   if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
       pnga_error("  g_c indices out of range ", g_c);

   /* verify if patch dimensions are consistent */
#define RESET() do {   \
   m = aihi - ailo +1; \
   k = ajhi - ajlo +1; \
   k2= bihi - bilo +1; \
   n = bjhi - bjlo +1; \
   cm= cihi - cilo +1; \
   cn= cjhi - cjlo +1; \
} while (0)
   RESET();
#define SHIFT(L,INC) do {      \
   L##ipos+=INC;               \
   L##jpos+=INC;               \
   L##ilo = L##lo[L##ipos];    \
   L##ihi = L##hi[L##ipos];    \
   L##jlo = L##lo[L##jpos];    \
   L##jhi = L##hi[L##jpos];    \
   L##dim1 = L##dims[L##ipos]; \
   L##dim2 = L##dims[L##jpos]; \
   RESET();                    \
} while (0)
   /* gai_setup_2d_patch may produce ambiguous vectors */
   if (!(m==cm && k==k2 && n==cn)) {
       /* patches don't agree */
       if (avpos>=0 && bvpos<0 && cvpos<0) {
           /* only A is an ambiguous vector */
           SHIFT(a,-1);
       }
       else if (avpos<0 && bvpos>=0 && cvpos<0) {
           /* only B is an ambiguous vector */
           SHIFT(b,-1);
       }
       else if (avpos<0 && bvpos<0 && cvpos>=0) {
           /* only C is an ambiguous vector */
           SHIFT(c,-1);
       }
       else if (avpos>=0 && bvpos>=0 && cvpos<0) {
           /* A and B are ambiguous vectors */
           if (m != cm) {
               SHIFT(a,-1);
           }
           if (n != cn) {
               SHIFT(b,-1);
           }
       }
       else if (avpos>=0 && bvpos<0 && cvpos>=0) {
           /* A and C are ambiguous vectors */
           if (k != k2) {
               SHIFT(a,-1);
           }
           if (n != cn) {
               SHIFT(c,-1);
           }
       }
       else if (avpos<0 && bvpos>=0 && cvpos>=0) {
           /* B and C are ambiguous vectors */
           if (k != k2) {
               SHIFT(b,-1);
           }
           if (m != cm) {
               SHIFT(c,-1);
           }
       }
       else if (avpos>=0 && bvpos>=0 && cvpos>=0) {
           /* A and B and C are ambiguous vectors */
           pnga_error("a and b and c ambiguous", 1);
       }
   }
   if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
   if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
   if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);
   
   chunk_cube = (k*(double)(m*n)) / (min_tasks * nproc);
   max_chunk = (Integer)pow(chunk_cube, (DoublePrecision)(1.0/3.0) );
   if (max_chunk < 32) max_chunk = 32;
   
#ifdef STATBUF
   if(atype ==  C_DBL || atype == C_FLOAT){
      Ichunk=D_CHUNK, Kchunk=D_CHUNK, Jchunk=D_CHUNK;
   }else{
      Ichunk=ICHUNK; Kchunk=KCHUNK; Jchunk=JCHUNK;
   }
#else
   {
     Integer elems, factor = sizeof(DoubleComplex)/GAsizeofM(atype);
     Ichunk = Jchunk = Kchunk = CHUNK_SIZE;
     
     if ( max_chunk > Ichunk) {       
       /*if memory if very limited, performance degrades for large matrices
	 as chunk size is very small, which leads to communication overhead)*/
       Integer avail = pnga_memory_avail_type(atype);
       pnga_gop(pnga_type_f2c(MT_F_INT), &avail, (Integer)1, "min");
       if(avail<MINMEM && pnga_nodeid()==0) pnga_error("Not enough memory",avail);
       elems = (Integer)(avail*0.9);/* Donot use every last drop */
       
       max_chunk=GA_MIN(max_chunk, (Integer)(sqrt( (double)((elems-EXTRA)/3))));
       Ichunk = GA_MIN(m,max_chunk);
       Jchunk = GA_MIN(n,max_chunk);
       Kchunk = GA_MIN(k,max_chunk);
     }
     else /* "EXTRA" elems for safety - just in case */
       elems = 3*Ichunk*Jchunk + EXTRA*factor;

     a = (DoubleComplex*) pnga_malloc(elems, atype, "GA mulmat bufs");     
     b = a + (Ichunk*Kchunk)/factor + 1; 
     c = b + (Kchunk*Jchunk)/factor + 1;
   }
#endif

   if(atype==C_DCPL){if((((DoubleComplex*)beta)->real == 0) &&
	       (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_SCPL){if((((SingleComplex*)beta)->real == 0) &&
	       (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_DBL){if(*(DoublePrecision *)beta == 0)need_scaling =0;}
   else if( *(float*)beta ==0) need_scaling =0;

   if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);
   else      pnga_fill_patch(g_c, clo, chi, beta);
  
   for(jlo = 0; jlo < n; jlo += Jchunk){ /* loop through columns of g_c patch */
       jhi = GA_MIN(n-1, jlo+Jchunk-1);
       jdim= jhi - jlo +1;
       
       for(klo = 0; klo < k; klo += Kchunk){    /* loop cols of g_a patch */
	 khi = GA_MIN(k-1, klo+Kchunk-1);        /* loop rows of g_b patch */
	 kdim= khi - klo +1;               

	 get_new_B = TRUE;
	 
	 for(ilo = 0; ilo < m; ilo += Ichunk){ /*loop through rows of g_c patch */
	   
	   if(ijk%nproc == iproc){
	     ihi = GA_MIN(m-1, ilo+Ichunk-1);
	     idim= cdim = ihi - ilo +1;
	     
	     if(atype == C_FLOAT) 
	       for (i = 0; i < idim*jdim; i++) *(((float*)c)+i)=0;
	     else if(atype ==  C_DBL)
	       for (i = 0; i < idim*jdim; i++) *(((double*)c)+i)=0;
	     else if(atype == C_SCPL)
	       for (i = 0; i < idim*jdim; i++){
                 ((SingleComplex*)c)[i].real=0;
                 ((SingleComplex*)c)[i].imag=0;
               }
             else
	       for (i = 0; i < idim*jdim; i++){ c[i].real=0;c[i].imag=0;}
	     
	     if (*transa == 'n' || *transa == 'N'){ 
	       adim = idim;
	       i0= ailo+ilo; i1= ailo+ihi;   
	       j0= ajlo+klo; j1= ajlo+khi;
	     }else{
	       adim = kdim;
	       i0= ajlo+klo; i1= ajlo+khi;   
	       j0= ailo+ilo; j1= ailo+ihi;
	     }

	     /* ga_get_(g_a, &i0, &i1, &j0, &j1, a, &adim); */
	     memcpy(tmplo,alo,arank*sizeof(Integer));
	     memcpy(tmphi,ahi,arank*sizeof(Integer));
	     SETINT(tmpld,1,arank-1);
	     tmplo[aipos]=i0; tmphi[aipos]=i1;
	     tmplo[ajpos]=j0; tmphi[ajpos]=j1;
	     tmpld[aipos]=i1-i0+1;
	     tmpld[ajpos]=j1-j0+1;
	     pnga_get(g_a,tmplo,tmphi,a,tmpld);
	     
	     if(get_new_B) {
	       if (*transb == 'n' || *transb == 'N'){ 
		 bdim = kdim;
		 i0= bilo+klo; i1= bilo+khi;   
		 j0= bjlo+jlo; j1= bjlo+jhi;
	       }else{
		 bdim = jdim;
		 i0= bjlo+jlo; i1= bjlo+jhi;   
		 j0= bilo+klo; j1= bilo+khi;
	       }
	       /* ga_get_(g_b, &i0, &i1, &j0, &j1, b, &bdim); */
	       memcpy(tmplo,blo,brank*sizeof(Integer));
	       memcpy(tmphi,bhi,brank*sizeof(Integer));
	       SETINT(tmpld,1,brank-1);
	       tmplo[bipos]=i0; tmphi[bipos]=i1;
	       tmplo[bjpos]=j0; tmphi[bjpos]=j1;
	       tmpld[bipos]=i1-i0+1;
	       tmpld[bjpos]=j1-j0+1;
	       pnga_get(g_b,tmplo,tmphi,b,tmpld);
	       get_new_B = FALSE;
	     }

	     idim_t=idim; jdim_t=jdim; kdim_t=kdim;
	     adim_t=adim; bdim_t=bdim; cdim_t=cdim;

		  switch(atype) {
		  case C_FLOAT:
		    BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (Real *)alpha, (Real *)a, &adim_t,
               (Real *)b, &bdim_t, (Real *)&ONE_CF,
               (Real *)c, &cdim_t);
		    break;
		  case C_DBL:
		    BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (DoublePrecision *)alpha, (DoublePrecision *)a, &adim_t,
               (DoublePrecision *)b, &bdim_t, (DoublePrecision *)&ONE,
               (DoublePrecision *)c, &cdim_t);
		    break;
		  case C_DCPL:
		    BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (DoubleComplex *)alpha, (DoubleComplex *)a, &adim_t,
               (DoubleComplex *)b, &bdim_t, (DoubleComplex *)&ONE,
               (DoubleComplex *)c, &cdim_t);
		    break;
		  case C_SCPL:
		    BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (SingleComplex *)alpha, (SingleComplex *)a, &adim_t,
               (SingleComplex *)b, &bdim_t, (SingleComplex *)&ONE_CF,
               (SingleComplex *)c, &cdim_t);
		    break;
		  default:
		    pnga_error("ga_matmul_patch: wrong data type", atype);
		  }

                  i0= cilo+ilo; i1= cilo+ihi;   j0= cjlo+jlo; j1= cjlo+jhi;
                  /* ga_acc_(g_c, &i0, &i1, &j0, &j1, (DoublePrecision*)c, 
                                            &cdim, (DoublePrecision*)&ONE); */
		  memcpy(tmplo,clo,crank*sizeof(Integer));
		  memcpy(tmphi,chi,crank*sizeof(Integer));
		  SETINT(tmpld,1,crank-1);
		  tmplo[cipos]=i0; tmphi[cipos]=i1;
		  tmplo[cjpos]=j0; tmphi[cjpos]=j1;
		  tmpld[cipos]=i1-i0+1;
		  tmpld[cjpos]=j1-j0+1;
		  if(atype == C_FLOAT || atype == C_SCPL) 
		    pnga_acc(g_c,tmplo,tmphi,(float *)c,tmpld, &ONE_CF);
		  else
		    pnga_acc(g_c,tmplo,tmphi,c,tmpld,(DoublePrecision*)&ONE);
               }
	   ++ijk;
	 }
       }
   }

#ifndef STATBUF
   pnga_free(a);
#endif
   
   if(local_sync_end)pnga_sync(); 
}